

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

void drwav_u8_to_s16(drwav_int16 *pOut,drwav_uint8 *pIn,size_t sampleCount)

{
  int x;
  size_t i;
  int r;
  size_t sampleCount_local;
  drwav_uint8 *pIn_local;
  drwav_int16 *pOut_local;
  
  for (i = 0; i < sampleCount; i = i + 1) {
    pOut[i] = (pIn[i] - 0x80) * 0x100;
  }
  return;
}

Assistant:

void drwav_u8_to_s16(drwav_int16* pOut, const drwav_uint8* pIn, size_t sampleCount)
{
    int r;
    for (size_t i = 0; i < sampleCount; ++i) {
        int x = pIn[i];
        r = x - 128;
        r = r << 8;
        pOut[i] = (short)r;
    }
}